

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_statistics(roaring_bitmap_t *r,roaring_statistics_t *stat)

{
  uint8_t typecode;
  container_t *c;
  int iVar1;
  int32_t iVar2;
  uint64_t uVar3;
  uint8_t uVar4;
  long lVar5;
  min_max_sum_t mms;
  undefined8 local_38;
  uint64_t local_30;
  
  stat->sum_value = 0;
  stat->cardinality = 0;
  stat->n_bytes_run_containers = 0;
  stat->n_bytes_bitset_containers = 0;
  stat->max_value = 0;
  stat->min_value = 0;
  stat->n_values_array_containers = 0;
  stat->n_values_run_containers = 0;
  stat->n_values_bitset_containers = 0;
  stat->n_bytes_array_containers = 0;
  stat->n_containers = 0;
  stat->n_array_containers = 0;
  stat->n_run_containers = 0;
  stat->n_bitset_containers = 0;
  stat->n_containers = (r->high_low_container).size;
  uVar3 = roaring_bitmap_get_cardinality(r);
  stat->cardinality = uVar3;
  local_38 = 0xffffffff;
  local_30 = 0;
  roaring_iterate(r,min_max_sum_fnc,&local_38);
  stat->max_value = (int)((ulong)local_38 >> 0x20);
  stat->min_value = (int)local_38;
  stat->sum_value = local_30;
  lVar5 = 0;
  do {
    if ((r->high_low_container).size <= lVar5) {
      return;
    }
    c = (r->high_low_container).containers[lVar5];
    typecode = (r->high_low_container).typecodes[lVar5];
    uVar4 = typecode;
    if (typecode == '\x04') {
      uVar4 = *(uint8_t *)((long)c + 8);
    }
    iVar1 = container_get_cardinality(c,typecode);
    iVar2 = container_size_in_bytes
                      ((r->high_low_container).containers[lVar5],
                       (r->high_low_container).typecodes[lVar5]);
    if (uVar4 == '\x03') {
      stat->n_run_containers = stat->n_run_containers + 1;
      stat->n_values_run_containers = stat->n_values_run_containers + iVar1;
      stat->n_bytes_run_containers = stat->n_bytes_run_containers + iVar2;
    }
    else if (uVar4 == '\x02') {
      stat->n_array_containers = stat->n_array_containers + 1;
      stat->n_values_array_containers = stat->n_values_array_containers + iVar1;
      stat->n_bytes_array_containers = stat->n_bytes_array_containers + iVar2;
    }
    else {
      if (uVar4 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x3be7,
                      "void roaring_bitmap_statistics(const roaring_bitmap_t *, roaring_statistics_t *)"
                     );
      }
      stat->n_bitset_containers = stat->n_bitset_containers + 1;
      stat->n_values_bitset_containers = stat->n_values_bitset_containers + iVar1;
      stat->n_bytes_bitset_containers = stat->n_bytes_bitset_containers + iVar2;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void roaring_bitmap_statistics(const roaring_bitmap_t *r,
                               roaring_statistics_t *stat) {
    const roaring_array_t *ra = &r->high_low_container;

    memset(stat, 0, sizeof(*stat));
    stat->n_containers = ra->size;
    stat->cardinality = roaring_bitmap_get_cardinality(r);
    min_max_sum_t mms;
    mms.min = UINT32_C(0xFFFFFFFF);
    mms.max = UINT32_C(0);
    mms.sum = 0;
    roaring_iterate(r, &min_max_sum_fnc, &mms);
    stat->min_value = mms.min;
    stat->max_value = mms.max;
    stat->sum_value = mms.sum;

    for (int i = 0; i < ra->size; ++i) {
        uint8_t truetype =
            get_container_type(ra->containers[i], ra->typecodes[i]);
        uint32_t card =
            container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        uint32_t sbytes =
            container_size_in_bytes(ra->containers[i], ra->typecodes[i]);
        switch (truetype) {
            case BITSET_CONTAINER_TYPE:
                stat->n_bitset_containers++;
                stat->n_values_bitset_containers += card;
                stat->n_bytes_bitset_containers += sbytes;
                break;
            case ARRAY_CONTAINER_TYPE:
                stat->n_array_containers++;
                stat->n_values_array_containers += card;
                stat->n_bytes_array_containers += sbytes;
                break;
            case RUN_CONTAINER_TYPE:
                stat->n_run_containers++;
                stat->n_values_run_containers += card;
                stat->n_bytes_run_containers += sbytes;
                break;
            default:
                assert(false);
                __builtin_unreachable();
        }
    }
}